

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_compare.cpp
# Opt level: O2

void __thiscall ktx::CommandCompare::executeCompare(CommandCompare *this)

{
  Reporter *report;
  _Alloc_hider *p_Var1;
  bool bVar2;
  OutputFormat OVar3;
  istream *piVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  CommandCompare *pCVar8;
  int iVar9;
  char *pcVar10;
  undefined8 *puVar11;
  char **args;
  size_t i_1;
  long lVar12;
  size_t i;
  bool bVar13;
  string_view filepath;
  string_view filepath_00;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  string_view fmt_04;
  string_view fmt_05;
  bool first;
  CommandCompare *local_9f8;
  char *nl;
  PrintIndent out_1;
  PrintIndent out;
  char *space;
  int local_9b0;
  int local_9ac;
  vector<int,_std::allocator<int>_> validationResults;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  validationMessages;
  PrintIndent pi;
  _Any_data local_958;
  code *local_948;
  code *pcStack_940;
  _Any_data local_938;
  code *local_928;
  code *local_920;
  PrintDiff diff;
  InputStreams inputStreams;
  
  report = &(this->super_Command).super_Reporter;
  InputStream::InputStream
            ((InputStream *)&inputStreams,(string *)&(this->options).super_OptionsCompare,report);
  InputStream::InputStream
            ((InputStream *)&inputStreams.field_0x3b8,
             (this->options).super_OptionsCompare.inputFilepaths._M_elems + 1,report);
  validationMessages.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  validationMessages.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  validationMessages.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  validationResults.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  validationResults.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  validationResults.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  OVar3 = (this->options).super_OptionsFormat.format;
  pcVar10 = (char *)(ulong)(OVar3 - json);
  local_9f8 = this;
  if (OVar3 - json < 2) {
    bVar13 = OVar3 == json;
    space = " ";
    if (!bVar13) {
      space = "";
    }
    nl = "\n";
    if (!bVar13) {
      nl = "";
    }
    out.indentWidth = (uint)bVar13 << 2;
    out.os = (ostream *)&std::cout;
    out.indentBase = 0;
    local_9b0 = out.indentWidth;
    PrintIndent::operator()(&out,0,(char (*) [5])0x1cef39,&nl);
    args = &space;
    PrintIndent::operator()
              (&out,1,(char (*) [64])
                      "\"$schema\":{}\"https://schema.khronos.org/ktx/compare_v0.json\",{}",args,&nl
              );
    puVar11 = (undefined8 *)&inputStreams.field_0x20;
    for (lVar12 = 0x58; lVar12 != 0x98; lVar12 = lVar12 + 0x20) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&diff);
      pi.indentBase = 0;
      pi.indentWidth = local_9b0;
      first = true;
      piVar4 = (istream *)*puVar11;
      filepath._M_str = (char *)args;
      filepath._M_len =
           *(size_t *)
            ((long)(local_9f8->options).super_OptionsCompare.inputFilepaths._M_elems +
            lVar12 + -0x58);
      pi.os = (ostream *)&diff;
      fmtInFile_abi_cxx11_
                ((string *)&out_1,
                 *(ktx **)((long)(local_9f8->options).super_OptionsCompare.inputFilepaths._M_elems +
                          lVar12 + -0x50),filepath);
      local_948 = (code *)0x0;
      pcStack_940 = (code *)0x0;
      local_958._M_unused._M_object = (void *)0x0;
      local_958._8_8_ = 0;
      local_958._M_unused._M_object = operator_new(0x20);
      *(bool **)local_958._M_unused._0_8_ = &first;
      *(PrintIndent **)((long)local_958._M_unused._0_8_ + 8) = &pi;
      *(char ***)((long)local_958._M_unused._0_8_ + 0x10) = &nl;
      *(char ***)((long)local_958._M_unused._0_8_ + 0x18) = &space;
      pcStack_940 = std::
                    _Function_handler<void_(const_ktx::ValidationReport_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_compare.cpp:1361:31)>
                    ::_M_invoke;
      local_948 = std::
                  _Function_handler<void_(const_ktx::ValidationReport_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_compare.cpp:1361:31)>
                  ::_M_manager;
      args = (char **)0x0;
      local_9ac = validateIOStream(piVar4,(string *)&out_1,false,false,
                                   (function<void_(const_ktx::ValidationReport_&)> *)&local_958);
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(&validationResults,&local_9ac);
      std::_Function_base::~_Function_base((_Function_base *)&local_958);
      std::__cxx11::string::~string((string *)&out_1);
      std::__cxx11::stringbuf::str();
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &validationMessages,(string *)&out_1);
      std::__cxx11::string::~string((string *)&out_1);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&diff);
      puVar11 = puVar11 + 0x77;
    }
    PrintIndent::operator()(&out,1,(char (*) [14])"\"valid\":{}[{}",&space,&nl);
    for (lVar12 = 0; lVar12 != 2; lVar12 = lVar12 + 1) {
      out_1.os = (ostream *)
                 CONCAT71(out_1.os._1_7_,
                          validationResults.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar12] == 0);
      pcVar10 = ",";
      if (lVar12 == 1) {
        pcVar10 = "";
      }
      diff.printIndent = (PrintIndent *)pcVar10;
      PrintIndent::operator()(&out,2,(char (*) [7])0x1d0f61,(bool *)&out_1,(char **)&diff,&nl);
    }
    PrintIndent::operator()(&out,1,(char (*) [5])0x1cf72c,&nl);
    PrintIndent::operator()(&out,1,(char (*) [17])"\"messages\":{}[{}",&space,&nl);
    for (lVar12 = 0; lVar12 != 0x40; lVar12 = lVar12 + 0x20) {
      if (*(long *)((long)&(validationMessages.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_M_string_length + lVar12)
          == 0) {
        pcVar10 = ",";
        if (lVar12 == 0x20) {
          pcVar10 = "";
        }
        diff.printIndent = (PrintIndent *)pcVar10;
        PrintIndent::operator()(&out,2,(char (*) [7])0x1e185c,(char **)&diff,&nl);
      }
      else {
        PrintIndent::operator()(&out,2,(char (*) [4])0x1cf785,&nl);
        puVar11 = (undefined8 *)
                  ((long)&((validationMessages.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar12);
        diff.printIndent = (PrintIndent *)*puVar11;
        diff._8_8_ = puVar11[1];
        args_00.field_1.values_ =
             (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&diff;
        args_00.desc_ = 0xd;
        fmt.size_ = 2;
        fmt.data_ = "{}";
        ::fmt::v10::vprint(fmt,args_00);
        PrintIndent::operator()(&out,3,(char (*) [5])0x1cdd65,&nl);
        pcVar10 = ",";
        if (lVar12 == 0x20) {
          pcVar10 = "";
        }
        diff.printIndent = (PrintIndent *)pcVar10;
        PrintIndent::operator()(&out,2,(char (*) [6])0x1e185d,(char **)&diff,&nl);
      }
    }
    PrintIndent::operator()(&out,1,(char (*) [2])0x1d9cf4);
    bVar13 = (local_9f8->options).super_OptionsCompare.allowInvalidInput;
    for (lVar12 = 0; lVar12 != 2; lVar12 = lVar12 + 1) {
      iVar9 = validationResults.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar12];
      if (iVar9 != 0) {
        if (iVar9 != 3) goto LAB_00126dca;
        if ((bVar13 & 1U) == 0) {
          iVar9 = 3;
          goto LAB_00126dca;
        }
        (local_9f8->options).super_OptionsCompare.contentMode = ignore;
      }
    }
    iVar9 = 0;
LAB_00126dca:
    diff.outputFormat = (local_9f8->options).super_OptionsFormat.format;
    diff.jsonSection.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_engaged = false;
    diff.jsonSectionEmpty = false;
    diff.firstContext = true;
    diff.context.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    diff.context.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
    diff.context.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
    diff.context.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    diff._81_8_ = 0;
    diff.printIndent = &out;
    if (iVar9 != 0) {
LAB_00126fd8:
      puVar11 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar11 = &PTR__exception_00240758;
      *(int *)(puVar11 + 1) = iVar9;
      __cxa_throw(puVar11,&FatalError::typeinfo,std::exception::~exception);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&out_1,"info",(allocator<char> *)&pi);
    PrintDiff::beginJsonSection(&diff,(string *)&out_1);
    pCVar8 = local_9f8;
    std::__cxx11::string::~string((string *)&out_1);
    compareHeader(pCVar8,&diff,&inputStreams);
    compareLevelIndex(pCVar8,&diff,&inputStreams);
    compareDFD(pCVar8,&diff,&inputStreams);
    compareKVD(pCVar8,&diff,&inputStreams);
    compareSGD(pCVar8,&diff,&inputStreams);
    PrintDiff::endJsonSection(&diff);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&out_1,"image",(allocator<char> *)&pi);
    PrintDiff::beginJsonSection(&diff,(string *)&out_1);
    std::__cxx11::string::~string((string *)&out_1);
    compareImages(pCVar8,&diff,&inputStreams);
    PrintDiff::endJsonSection(&diff);
    if (diff.different == true) {
      iVar9 = 7;
      goto LAB_00126fd8;
    }
    out_1.os = (ostream *)nl;
    args_03.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&out_1;
    args_03.desc_ = 0xcc;
    fmt_05.size_ = 6;
    fmt_05.data_ = "{}}}{}";
    ::fmt::v10::vprint(fmt_05,args_03);
  }
  else {
    if (OVar3 != text) goto LAB_00126f67;
    puVar11 = (undefined8 *)&inputStreams.field_0x20;
    for (lVar12 = 0x58; lVar12 != 0x98; lVar12 = lVar12 + 0x20) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&diff);
      piVar4 = (istream *)*puVar11;
      filepath_00._M_str = pcVar10;
      filepath_00._M_len =
           *(size_t *)
            ((long)(local_9f8->options).super_OptionsCompare.inputFilepaths._M_elems +
            lVar12 + -0x58);
      fmtInFile_abi_cxx11_
                ((string *)&out_1,
                 *(ktx **)((long)(local_9f8->options).super_OptionsCompare.inputFilepaths._M_elems +
                          lVar12 + -0x50),filepath_00);
      local_938._8_8_ = 0;
      local_920 = std::
                  _Function_handler<void_(const_ktx::ValidationReport_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_compare.cpp:1294:31)>
                  ::_M_invoke;
      local_928 = std::
                  _Function_handler<void_(const_ktx::ValidationReport_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_compare.cpp:1294:31)>
                  ::_M_manager;
      pcVar10 = (char *)0x0;
      local_938._M_unused._0_8_ = (undefined8)&diff;
      iVar9 = validateIOStream(piVar4,(string *)&out_1,false,false,
                               (function<void_(const_ktx::ValidationReport_&)> *)&local_938);
      out.os = (ostream *)CONCAT44(out.os._4_4_,iVar9);
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(&validationResults,(int *)&out);
      std::_Function_base::~_Function_base((_Function_base *)&local_938);
      std::__cxx11::string::~string((string *)&out_1);
      std::__cxx11::stringbuf::str();
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &validationMessages,(string *)&out_1);
      std::__cxx11::string::~string((string *)&out_1);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&diff);
      puVar11 = puVar11 + 0x77;
    }
    bVar13 = false;
    for (lVar12 = 0; lVar12 != 8; lVar12 = lVar12 + 4) {
      if ((&(validationMessages.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_string_length)[lVar12] != 0) {
        if (bVar13) {
          auVar5._8_8_ = 0;
          auVar5._0_8_ = (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&diff;
          fmt_00.size_ = 1;
          fmt_00.data_ = "\n";
          ::fmt::v10::vprint(fmt_00,(format_args)(auVar5 << 0x40));
        }
        pcVar10 = "failed";
        if (*(int *)((long)validationResults.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start + lVar12) == 0) {
          pcVar10 = "successful";
        }
        p_Var1 = &(local_9f8->options).super_OptionsCompare.inputFilepaths._M_elems[0]._M_dataplus +
                 lVar12;
        diff.jsonSection.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)p_Var1->_M_p;
        diff.jsonSection.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._M_value._M_string_length = (size_type)p_Var1[1];
        args_01.field_1.values_ =
             (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&diff;
        args_01.desc_ = 0xdc;
        fmt_01.size_ = 0x17;
        fmt_01.data_ = "Validation {} for \'{}\'\n";
        diff.printIndent = (PrintIndent *)pcVar10;
        ::fmt::v10::vprint(fmt_01,args_01);
        auVar6._8_8_ = 0;
        auVar6._0_8_ = (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&diff;
        fmt_02.size_ = 1;
        fmt_02.data_ = "\n";
        ::fmt::v10::vprint(fmt_02,(format_args)(auVar6 << 0x40));
        diff.printIndent =
             (PrintIndent *)
             (&(validationMessages.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)[lVar12]._M_p;
        diff._8_8_ = (&(validationMessages.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus + lVar12)[1];
        args_02.field_1.values_ =
             (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&diff;
        args_02.desc_ = 0xd;
        fmt_03.size_ = 2;
        fmt_03.data_ = "{}";
        ::fmt::v10::vprint(fmt_03,args_02);
        bVar13 = true;
      }
    }
    bVar2 = (local_9f8->options).super_OptionsCompare.allowInvalidInput;
    for (lVar12 = 0; lVar12 != 2; lVar12 = lVar12 + 1) {
      if (validationResults.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[lVar12] != 0) {
        if ((validationResults.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[lVar12] != 3) || ((bVar2 & 1U) == 0)) {
          puVar11 = (undefined8 *)__cxa_allocate_exception(0x10);
          iVar9 = validationResults.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar12];
          *puVar11 = &PTR__exception_00240758;
          *(int *)(puVar11 + 1) = iVar9;
          __cxa_throw(puVar11,&FatalError::typeinfo,std::exception::~exception);
        }
        (local_9f8->options).super_OptionsCompare.contentMode = ignore;
      }
    }
    if (bVar13) {
      auVar7._8_8_ = 0;
      auVar7._0_8_ = &diff;
      fmt_04.size_ = 1;
      fmt_04.data_ = "\n";
      ::fmt::v10::vprint(fmt_04,(format_args)(auVar7 << 0x40));
    }
    pCVar8 = local_9f8;
    out_1.os = (ostream *)&std::cout;
    out_1.indentBase = 0;
    out_1.indentWidth = 4;
    diff.outputFormat = (local_9f8->options).super_OptionsFormat.format;
    diff.jsonSection.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_engaged = false;
    diff.jsonSectionEmpty = false;
    diff.firstContext = true;
    diff.context.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    diff.context.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
    diff.context.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
    diff.context.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    diff._81_8_ = 0;
    diff.printIndent = &out_1;
    compareHeader(local_9f8,&diff,&inputStreams);
    compareLevelIndex(pCVar8,&diff,&inputStreams);
    compareDFD(pCVar8,&diff,&inputStreams);
    compareKVD(pCVar8,&diff,&inputStreams);
    compareSGD(pCVar8,&diff,&inputStreams);
    compareImages(pCVar8,&diff,&inputStreams);
    if (diff.different == true) {
      puVar11 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar11 = &PTR__exception_00240758;
      *(undefined4 *)(puVar11 + 1) = 7;
      __cxa_throw(puVar11,&FatalError::typeinfo,std::exception::~exception);
    }
  }
  PrintDiff::~PrintDiff(&diff);
LAB_00126f67:
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&validationResults.super__Vector_base<int,_std::allocator<int>_>);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&validationMessages);
  std::array<ktx::InputStream,_2UL>::~array(&inputStreams);
  return;
}

Assistant:

void CommandCompare::executeCompare() {
    InputStreams inputStreams{
        InputStream(options.inputFilepaths[0], *this),
        InputStream(options.inputFilepaths[1], *this),
    };

    std::vector<std::string> validationMessages;
    std::vector<int> validationResults;

    switch (options.format) {
    case OutputFormat::text: {
        for (std::size_t i = 0; i < inputStreams.size(); ++i) {
            std::ostringstream messagesOS;
            validationResults.emplace_back(validateIOStream(inputStreams[i], fmtInFile(options.inputFilepaths[i]),
                false, false, [&](const ValidationReport& issue) {
                fmt::print(messagesOS, "{}-{:04}: {}\n", toString(issue.type), issue.id, issue.message);
                fmt::print(messagesOS, "    {}\n", issue.details);
            }));

            validationMessages.emplace_back(std::move(messagesOS).str());
        }

        bool hasValidationMessages = false;
        for (std::size_t i = 0; i < inputStreams.size(); ++i) {
            if (!validationMessages[i].empty()) {
                if (std::exchange(hasValidationMessages, true))
                    fmt::print("\n");

                fmt::print("Validation {} for '{}'\n", validationResults[i] == 0 ? "successful" : "failed",
                            options.inputFilepaths[i]);
                fmt::print("\n");
                fmt::print("{}", validationMessages[i]);
            }
        }

        for (std::size_t i = 0; i < inputStreams.size(); ++i) {
            if (validationResults[i] != 0) {
                if (validationResults[i] != +rc::INVALID_FILE || !options.allowInvalidInput)
                    throw FatalError(ReturnCode{validationResults[i]});

                // Image comparison is only supported for valid input files
                options.contentMode = ContentMode::ignore;
            }
        }

        if (hasValidationMessages)
            fmt::print("\n");

        PrintIndent out{std::cout};
        PrintDiff diff(out, options.format);
        compareHeader(diff, inputStreams);
        compareLevelIndex(diff, inputStreams);
        compareDFD(diff, inputStreams);
        compareKVD(diff, inputStreams);
        compareSGD(diff, inputStreams);
        compareImages(diff, inputStreams);

        if (diff.isDifferent())
            throw FatalError(rc::DIFFERENCE_FOUND);

        break;
    }
    case OutputFormat::json: [[fallthrough]];
    case OutputFormat::json_mini: {
        int fatalValidationError = 0;

        const auto baseIndent = options.format == OutputFormat::json ? +0 : 0;
        const auto indentWidth = options.format == OutputFormat::json ? 4 : 0;
        const auto space = options.format == OutputFormat::json ? " " : "";
        const auto nl = options.format == OutputFormat::json ? "\n" : "";

        PrintIndent out{std::cout, baseIndent, indentWidth};
        out(0, "{{{}", nl);
        out(1, "\"$schema\":{}\"https://schema.khronos.org/ktx/compare_v0.json\",{}", space, nl);

        for (std::size_t i = 0; i < inputStreams.size(); ++i) {
            std::ostringstream messagesOS;
            PrintIndent pi{messagesOS, baseIndent, indentWidth};

            bool first = true;
            validationResults.emplace_back(validateIOStream(inputStreams[i], fmtInFile(options.inputFilepaths[i]),
                false, false, [&](const ValidationReport& issue) {
                if (!std::exchange(first, false)) {
                    pi(3, "}},{}", nl);
                }
                pi(3, "{{{}", nl);
                pi(4, "\"id\":{}{},{}", space, issue.id, nl);
                pi(4, "\"type\":{}\"{}\",{}", space, toString(issue.type), nl);
                pi(4, "\"message\":{}\"{}\",{}", space, escape_json_copy(issue.message), nl);
                pi(4, "\"details\":{}\"{}\"{}", space, escape_json_copy(issue.details), nl);
            }));

            validationMessages.emplace_back(std::move(messagesOS).str());
        }

        out(1, "\"valid\":{}[{}", space, nl);
        for (std::size_t i = 0; i < inputStreams.size(); ++i) {
            bool last = (i == inputStreams.size() - 1);
            out(2, "{}{}{}", validationResults[i] == 0, last ? "" : ",", nl);
        }
        out(1, "],{}", nl);

        out(1, "\"messages\":{}[{}", space, nl);
        for (std::size_t i = 0; i < inputStreams.size(); ++i) {
            bool last = (i == inputStreams.size() - 1);
            if (!validationMessages[i].empty()) {
                out(2, "[{}", nl);
                fmt::print("{}", validationMessages[i]);
                out(3, "}}{}", nl);
                out(2, "]{}{}", last ? "" : ",", nl);
            } else {
                out(2, "[]{}{}", last ? "" : ",", nl);
            }
        }
        out(1, "]");

        for (std::size_t i = 0; i < inputStreams.size(); ++i) {
            if (validationResults[i] != 0) {
                if (validationResults[i] != +rc::INVALID_FILE || !options.allowInvalidInput) {
                    fatalValidationError = validationResults[i];
                    break;
                }

                // Image comparison is only supported for valid input files
                options.contentMode = ContentMode::ignore;
            }
        }

        PrintDiff diff(out, options.format);

        try {
            if (fatalValidationError)
                throw FatalError(ReturnCode{fatalValidationError});

            diff.beginJsonSection("info");
            compareHeader(diff, inputStreams);
            compareLevelIndex(diff, inputStreams);
            compareDFD(diff, inputStreams);
            compareKVD(diff, inputStreams);
            compareSGD(diff, inputStreams);
            diff.endJsonSection();

            diff.beginJsonSection("image");
            compareImages(diff, inputStreams);
            diff.endJsonSection();

            if (diff.isDifferent())
                throw FatalError(rc::DIFFERENCE_FOUND);
        } catch (...) {
            diff.endJsonSection();
            fmt::print("{}}}{}", nl, nl);
            throw;
        }
        fmt::print("{}}}{}", nl, nl);
        break;
    }
    }
}